

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::variable_statement::print(variable_statement *this,wostream *os)

{
  ulong uVar1;
  long lVar2;
  
  std::operator<<(os,"variable_statement{[");
  if ((this->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::operator<<(os,", ");
      }
      mjs::operator<<(os,(declaration *)
                         ((long)&(((this->l_).
                                   super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id_)._M_dataplus._M_p
                         + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < (ulong)(((long)(this->l_).
                                    super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_).
                                    super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "variable_statement{[";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << l_[i];
        }
        os << "]}";
    }